

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
carver::Carver::calculateLowestEnergyPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Carver *this,Mat *source)

{
  Carver *this_00;
  int iVar1;
  _InputArray *p_Var2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  Carver *this_01;
  uint uVar6;
  Point minIdxPoint;
  vector<double,_std::allocator<double>_> nextHops;
  _InputArray local_c0 [2];
  Mat lastRow;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)*(int *)(source + 8),(allocator_type *)&lastRow);
  std::vector<double,_std::allocator<double>_>::vector(&nextHops,3,(allocator_type *)&lastRow);
  minIdxPoint.x = 0;
  minIdxPoint.y = 0;
  cv::Mat::row(&lastRow,(int)source);
  local_c0[0].sz.width = 0;
  local_c0[0].sz.height = 0;
  local_c0[0].flags = 0x1010000;
  local_c0[0].obj = &lastRow;
  p_Var2 = (_InputArray *)cv::noArray();
  cv::minMaxLoc(local_c0,(double *)0x0,(double *)0x0,(Point_ *)&minIdxPoint,(Point_ *)0x0,p_Var2);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start[(long)*(int *)(source + 8) + -1] = minIdxPoint.x;
  this_00 = (Carver *)(local_c0 + 1);
  uVar5 = minIdxPoint.x;
  for (uVar6 = *(int *)(source + 8) - 2; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
    uVar3 = 1;
    if (1 < (int)uVar5) {
      uVar3 = (ulong)uVar5;
    }
    lVar4 = **(long **)(source + 0x48) * (ulong)uVar6 + *(long *)(source + 0x10);
    *nextHops.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = *(double *)(lVar4 + -8 + uVar3 * 8);
    nextHops.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = *(double *)(lVar4 + (long)(int)uVar5 * 8);
    iVar1 = *(int *)(source + 0xc) + -1;
    if ((int)(uVar5 + 1) <= *(int *)(source + 0xc) + -1) {
      iVar1 = uVar5 + 1;
    }
    nextHops.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = *(double *)(lVar4 + (long)iVar1 * 8);
    this_01 = this_00;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)this_00,&nextHops);
    iVar1 = findMinOffset_(this_01,(vector<double,_std::allocator<double>_> *)this_00);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)this_00);
    uVar5 = iVar1 + uVar5;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    if ((int)(*(int *)(source + 0xc) - 1U) < (int)uVar5) {
      uVar5 = *(int *)(source + 0xc) - 1U;
    }
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar6] = uVar5;
  }
  cv::Mat::~Mat(&lastRow);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&nextHops.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<int> Carver::calculateLowestEnergyPath(cv::Mat &source) {
    vector<int> path(source.rows);
    vector<double> nextHops(3);
    int delta = 0;

    // Find the minimum of the last row, that is our starting point
    cv::Point minIdxPoint;
    int minIdx;
    cv::Mat lastRow = source.row(source.rows - 1);
    cv::minMaxLoc(lastRow, nullptr, nullptr, &minIdxPoint, nullptr);
    minIdx = minIdxPoint.x;
    path[source.rows - 1] = minIdx;

    for (int r = source.rows - 2; r >= 0; r--) {
        nextHops[0] = source.at<double>(r, max(minIdx - 1, 0));
        nextHops[1] = source.at<double>(r, minIdx);
        nextHops[2] = source.at<double>(r, min(minIdx + 1, source.cols - 1));

        delta = findMinOffset_(nextHops);

        // Add the discovered minimum index to our path, taking care
        // not to cross image boundaries
        minIdx += delta;
        minIdx = min(max(minIdx, 0), source.cols - 1);
        path[r] = minIdx;
    }

    return path;
}